

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O3

stat * tree_current_stat(tree *t)

{
  int iVar1;
  
  if ((t->flags & 0x10) == 0) {
    iVar1 = fstatat(t->working_dir_fd,t->basename,(stat *)&t->st,0);
    if (iVar1 != 0) {
      return (stat *)0x0;
    }
    *(byte *)&t->flags = (byte)t->flags | 0x10;
  }
  return &t->st;
}

Assistant:

static const struct stat *
tree_current_stat(struct tree *t)
{
	if (!(t->flags & hasStat)) {
#ifdef HAVE_FSTATAT
		if (fstatat(tree_current_dir_fd(t),
		    tree_current_access_path(t), &t->st, 0) != 0)
#else
		if (tree_enter_working_dir(t) != 0)
			return NULL;
		if (stat(tree_current_access_path(t), &t->st) != 0)
#endif
			return NULL;
		t->flags |= hasStat;
	}
	return (&t->st);
}